

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestValueTestcheckNormalizeFloatingPointStr::runTestCase
          (TestValueTestcheckNormalizeFloatingPointStr *this)

{
  TestResult *pTVar1;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_30,"0.0",&local_71);
  std::__cxx11::string::string((string *)&local_70,"0.0",&local_72);
  ValueTest::normalizeFloatingPointStr(&local_50,&local_70);
  JsonTest::checkStringEqual
            (pTVar1,&local_30,&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7d,"\"0.0\" == normalizeFloatingPointStr(\"0.0\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_30,"0e0",&local_71);
  std::__cxx11::string::string((string *)&local_70,"0e0",&local_72);
  ValueTest::normalizeFloatingPointStr(&local_50,&local_70);
  JsonTest::checkStringEqual
            (pTVar1,&local_30,&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7e,"\"0e0\" == normalizeFloatingPointStr(\"0e0\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_30,"1234.0",&local_71);
  std::__cxx11::string::string((string *)&local_70,"1234.0",&local_72);
  ValueTest::normalizeFloatingPointStr(&local_50,&local_70);
  JsonTest::checkStringEqual
            (pTVar1,&local_30,&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7f,"\"1234.0\" == normalizeFloatingPointStr(\"1234.0\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_30,"1234.0e0",&local_71);
  std::__cxx11::string::string((string *)&local_70,"1234.0e0",&local_72);
  ValueTest::normalizeFloatingPointStr(&local_50,&local_70);
  JsonTest::checkStringEqual
            (pTVar1,&local_30,&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x81,"\"1234.0e0\" == normalizeFloatingPointStr(\"1234.0e0\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_30,"1234.0e+0",&local_71);
  std::__cxx11::string::string((string *)&local_70,"1234.0e+0",&local_72);
  ValueTest::normalizeFloatingPointStr(&local_50,&local_70);
  JsonTest::checkStringEqual
            (pTVar1,&local_30,&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x83,"\"1234.0e+0\" == normalizeFloatingPointStr(\"1234.0e+0\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_30,"1234e-1",&local_71);
  std::__cxx11::string::string((string *)&local_70,"1234e-1",&local_72);
  ValueTest::normalizeFloatingPointStr(&local_50,&local_70);
  JsonTest::checkStringEqual
            (pTVar1,&local_30,&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x84,"\"1234e-1\" == normalizeFloatingPointStr(\"1234e-1\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_30,"1234e10",&local_71);
  std::__cxx11::string::string((string *)&local_70,"1234e10",&local_72);
  ValueTest::normalizeFloatingPointStr(&local_50,&local_70);
  JsonTest::checkStringEqual
            (pTVar1,&local_30,&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x85,"\"1234e10\" == normalizeFloatingPointStr(\"1234e10\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_30,"1234e10",&local_71);
  std::__cxx11::string::string((string *)&local_70,"1234e010",&local_72);
  ValueTest::normalizeFloatingPointStr(&local_50,&local_70);
  JsonTest::checkStringEqual
            (pTVar1,&local_30,&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x87,"\"1234e10\" == normalizeFloatingPointStr(\"1234e010\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_30,"1234e+10",&local_71);
  std::__cxx11::string::string((string *)&local_70,"1234e+010",&local_72);
  ValueTest::normalizeFloatingPointStr(&local_50,&local_70);
  JsonTest::checkStringEqual
            (pTVar1,&local_30,&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x89,"\"1234e+10\" == normalizeFloatingPointStr(\"1234e+010\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_30,"1234e-10",&local_71);
  std::__cxx11::string::string((string *)&local_70,"1234e-010",&local_72);
  ValueTest::normalizeFloatingPointStr(&local_50,&local_70);
  JsonTest::checkStringEqual
            (pTVar1,&local_30,&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8b,"\"1234e-10\" == normalizeFloatingPointStr(\"1234e-010\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_30,"1234e+100",&local_71);
  std::__cxx11::string::string((string *)&local_70,"1234e+100",&local_72);
  ValueTest::normalizeFloatingPointStr(&local_50,&local_70);
  JsonTest::checkStringEqual
            (pTVar1,&local_30,&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8d,"\"1234e+100\" == normalizeFloatingPointStr(\"1234e+100\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_30,"1234e-100",&local_71);
  std::__cxx11::string::string((string *)&local_70,"1234e-100",&local_72);
  ValueTest::normalizeFloatingPointStr(&local_50,&local_70);
  JsonTest::checkStringEqual
            (pTVar1,&local_30,&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8f,"\"1234e-100\" == normalizeFloatingPointStr(\"1234e-100\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_30,"1234e+1",&local_71);
  std::__cxx11::string::string((string *)&local_70,"1234e+001",&local_72);
  ValueTest::normalizeFloatingPointStr(&local_50,&local_70);
  JsonTest::checkStringEqual
            (pTVar1,&local_30,&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x91,"\"1234e+1\" == normalizeFloatingPointStr(\"1234e+001\")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, checkNormalizeFloatingPointStr) {
  JSONTEST_ASSERT_STRING_EQUAL("0.0", normalizeFloatingPointStr("0.0"));
  JSONTEST_ASSERT_STRING_EQUAL("0e0", normalizeFloatingPointStr("0e0"));
  JSONTEST_ASSERT_STRING_EQUAL("1234.0", normalizeFloatingPointStr("1234.0"));
  JSONTEST_ASSERT_STRING_EQUAL("1234.0e0",
                               normalizeFloatingPointStr("1234.0e0"));
  JSONTEST_ASSERT_STRING_EQUAL("1234.0e+0",
                               normalizeFloatingPointStr("1234.0e+0"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e-1", normalizeFloatingPointStr("1234e-1"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e10", normalizeFloatingPointStr("1234e10"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e10",
                               normalizeFloatingPointStr("1234e010"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e+10",
                               normalizeFloatingPointStr("1234e+010"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e-10",
                               normalizeFloatingPointStr("1234e-010"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e+100",
                               normalizeFloatingPointStr("1234e+100"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e-100",
                               normalizeFloatingPointStr("1234e-100"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e+1",
                               normalizeFloatingPointStr("1234e+001"));
}